

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereRangeVectorLen(Parse *pParse,int iCur,Index *pIdx,int nEq,WhereTerm *pTerm)

{
  Expr *pExpr;
  Expr *pEVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  CollSeq *pCVar5;
  int local_5c;
  Expr *local_58;
  Expr *pRhs;
  Expr *pLhs;
  CollSeq *pColl;
  int local_38;
  char idxaff;
  char aff;
  int i;
  int nCmp;
  WhereTerm *pTerm_local;
  int nEq_local;
  Index *pIdx_local;
  int iCur_local;
  Parse *pParse_local;
  
  local_5c = sqlite3ExprVectorSize(pTerm->pExpr->pLeft);
  if ((int)((uint)pIdx->nColumn - nEq) <= local_5c) {
    local_5c = (uint)pIdx->nColumn - nEq;
  }
  local_38 = 1;
  while( true ) {
    if (local_5c <= local_38) {
      return local_38;
    }
    pExpr = ((pTerm->pExpr->pLeft->x).pList)->a[local_38].pExpr;
    pEVar1 = pTerm->pExpr->pRight;
    if ((pEVar1->flags & 0x1000) == 0) {
      local_58 = ((pEVar1->x).pList)->a[local_38].pExpr;
    }
    else {
      local_58 = ((pEVar1->x).pSelect)->pEList->a[local_38].pExpr;
    }
    if (pExpr->op != 0xa7) {
      return local_38;
    }
    if (pExpr->iTable != iCur) {
      return local_38;
    }
    if (pExpr->iColumn != pIdx->aiColumn[local_38 + nEq]) {
      return local_38;
    }
    if (pIdx->aSortOrder[local_38 + nEq] != pIdx->aSortOrder[nEq]) {
      return local_38;
    }
    cVar2 = sqlite3ExprAffinity(pExpr);
    cVar2 = sqlite3CompareAffinity(local_58,cVar2);
    cVar3 = sqlite3TableColumnAffinity(pIdx->pTable,(int)pExpr->iColumn);
    if (cVar2 != cVar3) {
      return local_38;
    }
    pCVar5 = sqlite3BinaryCompareCollSeq(pParse,pExpr,local_58);
    if (pCVar5 == (CollSeq *)0x0) {
      return local_38;
    }
    iVar4 = sqlite3StrICmp(pCVar5->zName,pIdx->azColl[local_38 + nEq]);
    if (iVar4 != 0) break;
    local_38 = local_38 + 1;
  }
  return local_38;
}

Assistant:

static int whereRangeVectorLen(
  Parse *pParse,       /* Parsing context */
  int iCur,            /* Cursor open on pIdx */
  Index *pIdx,         /* The index to be used for a inequality constraint */
  int nEq,             /* Number of prior equality constraints on same index */
  WhereTerm *pTerm     /* The vector inequality constraint */
){
  int nCmp = sqlite3ExprVectorSize(pTerm->pExpr->pLeft);
  int i;

  nCmp = MIN(nCmp, (pIdx->nColumn - nEq));
  for(i=1; i<nCmp; i++){
    /* Test if comparison i of pTerm is compatible with column (i+nEq)
    ** of the index. If not, exit the loop.  */
    char aff;                     /* Comparison affinity */
    char idxaff = 0;              /* Indexed columns affinity */
    CollSeq *pColl;               /* Comparison collation sequence */
    Expr *pLhs, *pRhs;

    assert( ExprUseXList(pTerm->pExpr->pLeft) );
    pLhs = pTerm->pExpr->pLeft->x.pList->a[i].pExpr;
    pRhs = pTerm->pExpr->pRight;
    if( ExprUseXSelect(pRhs) ){
      pRhs = pRhs->x.pSelect->pEList->a[i].pExpr;
    }else{
      pRhs = pRhs->x.pList->a[i].pExpr;
    }

    /* Check that the LHS of the comparison is a column reference to
    ** the right column of the right source table. And that the sort
    ** order of the index column is the same as the sort order of the
    ** leftmost index column.  */
    if( pLhs->op!=TK_COLUMN
     || pLhs->iTable!=iCur
     || pLhs->iColumn!=pIdx->aiColumn[i+nEq]
     || pIdx->aSortOrder[i+nEq]!=pIdx->aSortOrder[nEq]
    ){
      break;
    }

    testcase( pLhs->iColumn==XN_ROWID );
    aff = sqlite3CompareAffinity(pRhs, sqlite3ExprAffinity(pLhs));
    idxaff = sqlite3TableColumnAffinity(pIdx->pTable, pLhs->iColumn);
    if( aff!=idxaff ) break;

    pColl = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
    if( pColl==0 ) break;
    if( sqlite3StrICmp(pColl->zName, pIdx->azColl[i+nEq]) ) break;
  }
  return i;
}